

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

function_record * pybind11::class_<LongReadsMapper>::get_function_record(handle h)

{
  bool bVar1;
  bool bVar2;
  PyObject **ppPVar3;
  function_record *local_68;
  handle in_stack_ffffffffffffffa8;
  PyTypeObject *local_50;
  handle local_30 [3];
  PyObject *local_18;
  handle local_10;
  function_record *local_8;
  
  local_18 = (PyObject *)pybind11::detail::get_function(in_stack_ffffffffffffffa8);
  local_10 = (handle)local_18;
  bVar2 = pybind11::handle::operator_cast_to_bool(&local_10);
  bVar1 = false;
  if (bVar2) {
    ppPVar3 = pybind11::handle::ptr(&local_10);
    if ((*(uint *)((*ppPVar3)[1].ob_refcnt + 0x10) & 0x20) == 0) {
      ppPVar3 = pybind11::handle::ptr(&local_10);
      local_50 = (*ppPVar3)[1].ob_type;
    }
    else {
      local_50 = (PyTypeObject *)0x0;
    }
    pybind11::handle::handle(local_30,(PyObject *)local_50);
    reinterpret_borrow<pybind11::capsule>(in_stack_ffffffffffffffa8);
    bVar1 = true;
    local_68 = capsule::operator_cast_to_function_record_((capsule *)0x417a6e);
  }
  else {
    local_68 = (function_record *)0x0;
  }
  local_8 = local_68;
  if (bVar1) {
    capsule::~capsule((capsule *)0x417aa4);
  }
  return local_8;
}

Assistant:

static detail::function_record *get_function_record(handle h) {
        h = detail::get_function(h);
        return h ? (detail::function_record *) reinterpret_borrow<capsule>(PyCFunction_GET_SELF(h.ptr()))
                 : nullptr;
    }